

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_int8.c
# Opt level: O3

rt_function_error_t exec_convolution_int8(rt_function_t *f)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 uVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  char cVar18;
  char cVar19;
  long lVar20;
  int iky;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long *plVar24;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t shape_01;
  rt_list_t shape_02;
  rt_list_t out;
  rt_list_t out_00;
  rt_list_t shape_03;
  rt_list_t shape_04;
  rt_list_t shape_05;
  rt_list_t pos;
  int i_pos [3];
  int w_pos [3];
  int o_pos [3];
  int local_124;
  int local_120;
  int local_11c [4];
  int local_10c;
  int local_108;
  int local_104;
  ulong local_100;
  int *local_f8;
  long *local_f0;
  int *local_e8;
  undefined8 local_e0;
  int *local_d8;
  uint local_cc;
  int local_c8 [6];
  ulong local_b0;
  long local_a8;
  int *local_a0;
  int *local_98;
  ulong local_90;
  int *local_88;
  int *local_80;
  ulong local_78;
  ulong local_70;
  int *local_68;
  ulong local_60;
  ulong local_58;
  int *local_50;
  int local_48;
  int local_44;
  long *local_40;
  ulong local_38;
  
  local_40 = (long *)f->local_context;
  plVar24 = (long *)*local_40;
  local_11c[3] = (int)local_40[8];
  local_108 = *(int *)(plVar24[10] + 8);
  local_10c = ((int *)plVar24[2])[2];
  shape._4_4_ = 0;
  shape.size = *(uint *)(plVar24 + 1);
  shape.data = (int *)plVar24[2];
  uVar5 = calc_shape_size(shape);
  shape_00._4_4_ = 0;
  shape_00.size = *(uint *)(plVar24 + 0x19);
  shape_00.data = (int *)plVar24[0x1a];
  uVar6 = calc_shape_size(shape_00);
  lVar14 = *plVar24;
  lVar15 = plVar24[0x18];
  if (lVar15 != 0) {
    bVar1 = *(byte *)(lVar15 + 0x10) >> 4;
    bVar2 = *(byte *)(lVar14 + 0x10) >> 4;
    if (bVar2 < bVar1) {
      if (uVar6 != 0) {
        lVar14 = *(long *)(lVar15 + 0x18);
        uVar16 = 0;
        do {
          *(char *)(lVar14 + uVar16) =
               (char)((int)*(char *)(lVar14 + uVar16) / (1 << (bVar1 - bVar2 & 0x1f)));
          uVar16 = uVar16 + 1;
        } while (uVar6 != uVar16);
        lVar14 = *plVar24;
      }
    }
    else if (bVar1 < bVar2) {
      puts(
          "OUTPUT variable has less range bits than BIAS variable. Please make sure conv/b has same or less range bits than Output to avoid overflow."
          );
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }
  memset(*(void **)(lVar14 + 0x18),0,(ulong)uVar5);
  local_cc = *(uint *)plVar24[10];
  local_f0 = plVar24;
  if ((int)plVar24[0x28] == 2) {
    if (local_cc == 0) {
      return RT_FUNCTION_ERROR_NOERROR;
    }
    local_100 = 0;
    do {
      local_c8[3] = (int)local_100;
      if (local_11c[3] != 0) {
        local_124 = 0;
        do {
          if (local_10c != 0) {
            local_c8[5] = 0;
            do {
              local_c8[4] = local_124;
              iVar11 = (int)plVar24[3];
              iVar12 = 0;
              if (0 < iVar11) {
                if (2 < iVar11) {
                  iVar11 = 3;
                }
                lVar14 = 0;
                iVar12 = 0;
                do {
                  iVar12 = iVar12 + *(int *)(plVar24[4] + lVar14 * 4) * local_c8[lVar14 + 3];
                  lVar14 = lVar14 + 1;
                } while (iVar11 != (int)lVar14);
              }
              *(int *)(plVar24 + 7) = iVar12;
              if (local_108 != 0) {
                local_11c[2] = 0;
                local_104 = local_c8[5];
                local_c8[1] = local_c8[5];
                do {
                  local_11c[0] = local_c8[3];
                  local_11c[1] = local_124;
                  local_c8[0] = local_124;
                  local_c8[2] = local_11c[2];
                  iVar11 = (int)plVar24[0xb];
                  iVar12 = 0;
                  if (0 < iVar11) {
                    if (2 < iVar11) {
                      iVar11 = 3;
                    }
                    lVar14 = 0;
                    iVar12 = 0;
                    do {
                      iVar12 = iVar12 + *(int *)(plVar24[0xc] + lVar14 * 4) * local_11c[lVar14];
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                  *(int *)(plVar24 + 0xf) = iVar12;
                  iVar11 = (int)plVar24[0x13];
                  local_88 = (int *)CONCAT44(local_88._4_4_,local_11c[2]);
                  if (iVar11 < 1) {
                    iVar12 = 0;
                  }
                  else {
                    if (2 < iVar11) {
                      iVar11 = 3;
                    }
                    lVar14 = 0;
                    iVar12 = 0;
                    do {
                      iVar12 = iVar12 + *(int *)(plVar24[0x14] + lVar14 * 4) * local_c8[lVar14];
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                  *(int *)(plVar24 + 0x17) = iVar12;
                  local_e8 = (int *)plVar24[0x2e];
                  iVar11 = *local_e8;
                  if (0 < iVar11) {
                    piVar4 = (int *)plVar24[0x2a];
                    local_68 = (int *)plVar24[0x2c];
                    local_a0 = (int *)local_40[5];
                    local_50 = (int *)local_40[7];
                    local_70 = *(long *)(*plVar24 + 0x18);
                    lVar14 = *(long *)(plVar24[8] + 0x18);
                    local_a8 = *(long *)(plVar24[0x10] + 0x18);
                    local_80 = (int *)local_40[3];
                    local_f8 = (int *)((ulong)local_f8 & 0xffffffff00000000);
                    local_d8 = (int *)CONCAT44(local_d8._4_4_,-*local_80);
                    iVar12 = 1 << (((*(byte *)(plVar24[8] + 0x10) >> 4) +
                                   (*(byte *)(plVar24[0x10] + 0x10) >> 4)) -
                                   (*(byte *)(*plVar24 + 0x10) >> 4) & 0x1f);
                    local_78 = CONCAT44(local_78._4_4_,iVar12);
                    local_58 = (ulong)(uint)local_e8[1];
                    do {
                      if (0 < (int)local_58) {
                        iVar11 = -local_80[1];
                        local_e0 = 0;
                        piVar13 = local_68;
                        do {
                          local_90 = (ulong)*piVar13;
                          local_60 = CONCAT44(local_60._4_4_,iVar11);
                          if ((long)local_90 < 1) {
                            iVar7 = 0;
                          }
                          else {
                            uVar5 = piVar13[1];
                            local_98 = (int *)(long)iVar11;
                            lVar20 = 0;
                            iVar7 = 0;
                            lVar15 = local_a8;
                            do {
                              if (0 < (int)uVar5) {
                                iVar21 = *local_50 * (int)lVar20 + (int)local_d8;
                                uVar16 = (ulong)uVar5;
                                lVar17 = (long)iVar11;
                                lVar23 = lVar15;
                                do {
                                  if (((-1 < lVar17) && (iVar3 = piVar4[1], lVar17 < iVar3)) &&
                                     ((-1 < iVar21 && (iVar21 < *piVar4)))) {
                                    iVar7 = iVar7 + (int)*(char *)(lVar23 + (ulong)*(uint *)(plVar24
                                                                                            + 0x17))
                                                    * (int)*(char *)(lVar17 + (ulong)(uint)(iVar3 * 
                                                  (*local_50 * (int)lVar20 + (int)local_d8)) +
                                                  (ulong)*(uint *)(plVar24 + 0xf) + lVar14);
                                  }
                                  lVar23 = lVar23 + 1;
                                  lVar17 = lVar17 + local_50[1];
                                  uVar16 = uVar16 - 1;
                                } while (uVar16 != 0);
                              }
                              lVar20 = lVar20 + 1;
                              lVar15 = lVar15 + (ulong)uVar5;
                            } while (lVar20 != local_90);
                          }
                          lVar15 = (long)((int)local_58 * (int)local_f8) +
                                   *(uint *)(plVar24 + 7) + local_70;
                          iVar21 = iVar7 / iVar12 + (int)*(char *)(local_e0 + lVar15);
                          iVar7 = iVar21;
                          if (iVar21 < -0x7f) {
                            iVar7 = 0x80;
                          }
                          uVar10 = (undefined1)iVar7;
                          if (0x7e < iVar21) {
                            uVar10 = 0x7f;
                          }
                          *(undefined1 *)(local_e0 + lVar15) = uVar10;
                          local_e0 = local_e0 + 1;
                          iVar11 = iVar11 + local_a0[1];
                          local_58 = (ulong)local_e8[1];
                          piVar13 = local_68;
                        } while (local_e0 < (long)local_58);
                        iVar11 = *local_e8;
                      }
                      iVar7 = (int)local_f8 + 1;
                      local_d8 = (int *)CONCAT44(local_d8._4_4_,(int)local_d8 + *local_a0);
                      local_f8 = (int *)CONCAT44(local_f8._4_4_,iVar7);
                    } while (iVar7 < iVar11);
                  }
                  local_11c[2] = local_11c[2] + 1;
                  local_c8[1] = local_104;
                } while (local_11c[2] != local_108);
              }
              local_11c[0] = local_124;
              local_11c[1] = local_c8[5];
              lVar14 = plVar24[0x20];
              if (lVar14 != 0) {
                iVar11 = (int)plVar24[0x23];
                if (iVar11 < 1) {
                  iVar12 = 0;
                }
                else {
                  if (1 < iVar11) {
                    iVar11 = 2;
                  }
                  lVar15 = 0;
                  iVar12 = 0;
                  do {
                    iVar12 = iVar12 + *(int *)(plVar24[0x24] + lVar15 * 4) * local_11c[lVar15];
                    lVar15 = lVar15 + 1;
                  } while (iVar11 != (int)lVar15);
                }
                *(int *)(plVar24 + 0x27) = iVar12;
                lVar15 = (long)*(int *)(plVar24[4] + 8);
                if (0 < lVar15) {
                  lVar20 = *(long *)(lVar14 + 0x18);
                  lVar17 = *(long *)(*plVar24 + 0x18);
                  bVar1 = *(byte *)(lVar14 + 0x10);
                  do {
                    *(char *)(lVar17 + (ulong)*(uint *)(plVar24 + 7)) =
                         (char)(((int)*(char *)(lVar17 + (ulong)*(uint *)(plVar24 + 7)) *
                                (int)*(char *)(lVar20 + (ulong)*(uint *)(plVar24 + 0x27))) /
                               (1 << (bVar1 >> 4)));
                    lVar17 = lVar17 + 1;
                    lVar15 = lVar15 + -1;
                  } while (lVar15 != 0);
                }
              }
              if (plVar24[0x18] != 0) {
                iVar11 = (int)plVar24[0x1b];
                if (iVar11 < 1) {
                  iVar12 = 0;
                }
                else {
                  if (1 < iVar11) {
                    iVar11 = 2;
                  }
                  lVar14 = 0;
                  iVar12 = 0;
                  do {
                    iVar12 = iVar12 + *(int *)(plVar24[0x1c] + lVar14 * 4) * local_11c[lVar14];
                    lVar14 = lVar14 + 1;
                  } while (iVar11 != (int)lVar14);
                }
                *(int *)(plVar24 + 0x1f) = iVar12;
                lVar14 = (long)*(int *)(plVar24[4] + 8);
                if (0 < lVar14) {
                  lVar15 = *(long *)(plVar24[0x18] + 0x18);
                  lVar20 = *(long *)(*plVar24 + 0x18);
                  do {
                    bVar1 = *(byte *)(lVar15 + (ulong)*(uint *)(plVar24 + 0x1f));
                    bVar2 = *(byte *)(lVar20 + (ulong)*(uint *)(plVar24 + 7));
                    cVar18 = bVar2 + bVar1;
                    if ((((char)bVar1 < '\x01') || ((char)bVar2 < '\x01')) ||
                       (cVar19 = '\x7f', -1 < cVar18)) {
                      cVar19 = cVar18;
                      if ('\0' < cVar18) {
                        cVar19 = -0x80;
                      }
                      if (-1 < (char)(bVar2 & bVar1)) {
                        cVar19 = cVar18;
                      }
                    }
                    *(char *)(lVar20 + (ulong)*(uint *)(plVar24 + 7)) = cVar19;
                    lVar20 = lVar20 + 1;
                    lVar14 = lVar14 + -1;
                  } while (lVar14 != 0);
                }
              }
              local_c8[5] = local_c8[5] + 1;
            } while (local_c8[5] != local_10c);
          }
          local_124 = local_124 + 1;
        } while (local_124 != local_11c[3]);
      }
      local_100 = (ulong)(local_c8[3] + 1U);
    } while (local_c8[3] + 1U != local_cc);
  }
  else {
    if (local_cc == 0) {
      return RT_FUNCTION_ERROR_NOERROR;
    }
    local_b0 = 0;
    do {
      if (local_11c[3] != 0) {
        local_120 = 0;
        do {
          if (local_10c != 0) {
            local_48 = 0;
            do {
              local_c8[3] = (int)local_b0;
              local_c8[4] = local_120;
              local_c8[5] = local_48;
              iVar11 = (int)plVar24[3];
              iVar12 = 0;
              if (0 < iVar11) {
                if (2 < iVar11) {
                  iVar11 = 3;
                }
                lVar14 = 0;
                iVar12 = 0;
                do {
                  iVar12 = iVar12 + *(int *)(plVar24[4] + lVar14 * 4) * local_c8[lVar14 + 3];
                  lVar14 = lVar14 + 1;
                } while (iVar11 != (int)lVar14);
              }
              *(int *)(plVar24 + 7) = iVar12;
              if (local_108 != 0) {
                local_11c[2] = 0;
                do {
                  local_11c[0] = (int)local_b0;
                  local_11c[1] = local_120;
                  local_c8[0] = local_120;
                  local_c8[1] = local_48;
                  local_c8[2] = local_11c[2];
                  iVar11 = (int)plVar24[0xb];
                  iVar12 = 0;
                  if (0 < iVar11) {
                    if (2 < iVar11) {
                      iVar11 = 3;
                    }
                    lVar14 = 0;
                    iVar12 = 0;
                    do {
                      iVar12 = iVar12 + *(int *)(plVar24[0xc] + lVar14 * 4) * local_11c[lVar14];
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                  *(int *)(plVar24 + 0xf) = iVar12;
                  iVar11 = (int)plVar24[0x13];
                  local_44 = local_11c[2];
                  if (iVar11 < 1) {
                    iVar12 = 0;
                  }
                  else {
                    if (2 < iVar11) {
                      iVar11 = 3;
                    }
                    lVar14 = 0;
                    iVar12 = 0;
                    do {
                      iVar12 = iVar12 + *(int *)(plVar24[0x14] + lVar14 * 4) * local_c8[lVar14];
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                  *(int *)(plVar24 + 0x17) = iVar12;
                  uVar16 = (ulong)*(uint *)(plVar24 + 0x28);
                  local_a0 = (int *)CONCAT44(local_a0._4_4_,(int)plVar24[0x29]);
                  local_d8 = (int *)plVar24[0x2a];
                  shape_01._4_4_ = 0;
                  shape_01.size = *(uint *)(plVar24 + 0x2d);
                  local_88 = (int *)plVar24[0x2e];
                  uVar5 = *(uint *)(plVar24 + 0x2b);
                  local_98 = (int *)plVar24[0x2c];
                  local_90 = CONCAT44(local_90._4_4_,(int)plVar24[0x2f]);
                  piVar4 = (int *)plVar24[0x30];
                  uVar6 = *(uint *)(plVar24 + 0x31);
                  local_f8 = (int *)plVar24[0x32];
                  local_58 = local_40[3];
                  local_100 = *(long *)(*plVar24 + 0x18);
                  local_e8 = *(int **)(plVar24[8] + 0x18);
                  local_68 = *(int **)(plVar24[0x10] + 0x18);
                  lVar14 = local_40[5];
                  lVar15 = local_40[7];
                  local_80 = (int *)CONCAT44(local_80._4_4_,*(uint *)(plVar24 + 0x2d));
                  shape_01.data = local_88;
                  uVar8 = calc_shape_size(shape_01);
                  piVar13 = local_f8;
                  local_50 = (int *)CONCAT44(local_50._4_4_,uVar5);
                  shape_02._4_4_ = 0;
                  shape_02.size = uVar5;
                  shape_02.data = local_98;
                  uVar5 = calc_shape_size(shape_02);
                  local_a8 = CONCAT44(local_a8._4_4_,uVar5);
                  if (uVar8 != 0) {
                    local_104 = 1 << (((*(byte *)(local_f0[8] + 0x10) >> 4) +
                                      (*(byte *)(local_f0[0x10] + 0x10) >> 4)) -
                                      (*(byte *)(*local_f0 + 0x10) >> 4) & 0x1f);
                    local_60 = (ulong)uVar5;
                    uVar22 = 0;
                    local_70 = uVar16;
                    local_38 = (ulong)uVar8;
                    do {
                      out._4_4_ = 0;
                      out.size = uVar6;
                      shape_04._0_8_ = (ulong)local_80 & 0xffffffff;
                      out.data = piVar13;
                      shape_04.data = local_88;
                      local_78 = uVar22;
                      pos_to_shape(out,shape_04,(int)uVar22);
                      if ((int)local_a8 == 0) {
                        local_e0 = (ulong)local_e0._4_4_ << 0x20;
                      }
                      else {
                        uVar22 = 0;
                        local_e0 = (ulong)local_e0._4_4_ << 0x20;
                        do {
                          out_00._0_8_ = local_90 & 0xffffffff;
                          shape_05._0_8_ = (ulong)local_50 & 0xffffffff;
                          out_00.data = piVar4;
                          shape_05.data = local_98;
                          pos_to_shape(out_00,shape_05,(int)uVar22);
                          plVar24 = local_f0;
                          if (0 < (int)uVar16) {
                            uVar9 = 0;
                            do {
                              iVar11 = piVar4[uVar9] * *(int *)(lVar15 + uVar9 * 4);
                              piVar4[uVar9] = iVar11;
                              iVar11 = iVar11 - *(int *)(local_58 + uVar9 * 4);
                              piVar4[uVar9] = iVar11;
                              iVar11 = *(int *)(lVar14 + uVar9 * 4) * piVar13[uVar9] + iVar11;
                              piVar4[uVar9] = iVar11;
                              if ((iVar11 < 0) || (local_d8[uVar9] <= iVar11)) goto LAB_0011ad67;
                              uVar9 = uVar9 + 1;
                            } while (uVar16 != uVar9);
                          }
                          lVar20 = (ulong)*(uint *)(local_f0 + 0xf) + (long)local_e8;
                          shape_03._0_8_ = (ulong)local_a0 & 0xffffffff;
                          pos._0_8_ = local_90 & 0xffffffff;
                          shape_03.data = local_d8;
                          pos.data = piVar4;
                          iVar11 = shape_to_pos(shape_03,pos);
                          local_e0 = CONCAT44(local_e0._4_4_,
                                              (int)local_e0 +
                                              (int)*(char *)(uVar22 + (ulong)*(uint *)(plVar24 +
                                                                                      0x17) +
                                                                      (long)local_68) *
                                              (int)*(char *)(iVar11 + lVar20));
                          piVar13 = local_f8;
                          uVar16 = local_70;
LAB_0011ad67:
                          uVar22 = uVar22 + 1;
                        } while (uVar22 != local_60);
                      }
                      iVar12 = (int)local_e0 / local_104 +
                               (int)*(char *)(local_78 + *(uint *)(local_f0 + 7) + local_100);
                      iVar11 = iVar12;
                      if (iVar12 < -0x7f) {
                        iVar11 = 0x80;
                      }
                      uVar10 = (undefined1)iVar11;
                      if (0x7e < iVar12) {
                        uVar10 = 0x7f;
                      }
                      *(undefined1 *)(local_78 + *(uint *)(local_f0 + 7) + local_100) = uVar10;
                      uVar22 = local_78 + 1;
                    } while (uVar22 != local_38);
                  }
                  local_11c[2] = local_44 + 1;
                  plVar24 = local_f0;
                } while (local_11c[2] != local_108);
              }
              local_11c[0] = local_120;
              local_11c[1] = local_48;
              lVar14 = plVar24[0x20];
              if (lVar14 != 0) {
                iVar11 = (int)plVar24[0x23];
                if (iVar11 < 1) {
                  iVar12 = 0;
                }
                else {
                  if (1 < iVar11) {
                    iVar11 = 2;
                  }
                  lVar15 = 0;
                  iVar12 = 0;
                  do {
                    iVar12 = iVar12 + *(int *)(plVar24[0x24] + lVar15 * 4) * local_11c[lVar15];
                    lVar15 = lVar15 + 1;
                  } while (iVar11 != (int)lVar15);
                }
                *(int *)(plVar24 + 0x27) = iVar12;
                lVar15 = (long)*(int *)(plVar24[4] + 8);
                if (0 < lVar15) {
                  lVar20 = *(long *)(lVar14 + 0x18);
                  lVar17 = *(long *)(*plVar24 + 0x18);
                  bVar1 = *(byte *)(lVar14 + 0x10);
                  do {
                    *(char *)(lVar17 + (ulong)*(uint *)(plVar24 + 7)) =
                         (char)(((int)*(char *)(lVar17 + (ulong)*(uint *)(plVar24 + 7)) *
                                (int)*(char *)(lVar20 + (ulong)*(uint *)(plVar24 + 0x27))) /
                               (1 << (bVar1 >> 4)));
                    lVar17 = lVar17 + 1;
                    lVar15 = lVar15 + -1;
                  } while (lVar15 != 0);
                }
              }
              if (plVar24[0x18] != 0) {
                iVar11 = (int)plVar24[0x1b];
                if (iVar11 < 1) {
                  iVar12 = 0;
                }
                else {
                  if (1 < iVar11) {
                    iVar11 = 2;
                  }
                  lVar14 = 0;
                  iVar12 = 0;
                  do {
                    iVar12 = iVar12 + *(int *)(plVar24[0x1c] + lVar14 * 4) * local_11c[lVar14];
                    lVar14 = lVar14 + 1;
                  } while (iVar11 != (int)lVar14);
                }
                *(int *)(plVar24 + 0x1f) = iVar12;
                lVar14 = (long)*(int *)(plVar24[4] + 8);
                if (0 < lVar14) {
                  lVar15 = *(long *)(plVar24[0x18] + 0x18);
                  lVar20 = *(long *)(*plVar24 + 0x18);
                  do {
                    bVar1 = *(byte *)(lVar15 + (ulong)*(uint *)(plVar24 + 0x1f));
                    bVar2 = *(byte *)(lVar20 + (ulong)*(uint *)(plVar24 + 7));
                    cVar18 = bVar2 + bVar1;
                    if ((((char)bVar1 < '\x01') || ((char)bVar2 < '\x01')) ||
                       (cVar19 = '\x7f', -1 < cVar18)) {
                      cVar19 = cVar18;
                      if ('\0' < cVar18) {
                        cVar19 = -0x80;
                      }
                      if (-1 < (char)(bVar2 & bVar1)) {
                        cVar19 = cVar18;
                      }
                    }
                    *(char *)(lVar20 + (ulong)*(uint *)(plVar24 + 7)) = cVar19;
                    lVar20 = lVar20 + 1;
                    lVar14 = lVar14 + -1;
                  } while (lVar14 != 0);
                }
              }
              local_48 = local_48 + 1;
            } while (local_48 != local_10c);
          }
          local_120 = local_120 + 1;
        } while (local_120 != local_11c[3]);
      }
      uVar5 = (int)local_b0 + 1;
      local_b0 = (ulong)uVar5;
    } while (uVar5 != local_cc);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_convolution_int8(rt_function_t *f) {
  convolution_local_context_t *c =
      (convolution_local_context_t *)f->local_context;
  convolution_private_t *p = (convolution_private_t *)(c->data);

  nn_size_t group = c->group;
  nn_size_t in_vars = p->in_var.shape.data[I];
  nn_size_t out_vars = p->out_var.shape.data[I];
  nn_size_t batch_size;
  nn_size_t om, im, g, b;

  var_t *out_var = &p->out_var;
  var_t *in_var = &p->in_var;
  var_t *w_var = &p->w_var;
  var_t *b_var = &p->b_var;
  var_t *a_var = &p->a_var;

  const unsigned output_size = calc_shape_size(out_var->shape);
  const unsigned bias_size = calc_shape_size(b_var->shape);

  if (p->b_var.v) {
    unsigned int b_fp = b_var->v->fp_pos;
    unsigned int out_fp = out_var->v->fp_pos;

    // If bias has less range bits (=more precision bits) than output, rescale
    // bias.
    // Otherwise, output has too few range bits. Change format before starting
    // computations.
    if (b_fp > out_fp) {
      int i;
      int8_t *b_data = (int8_t *)(b_var->v->data);
      for (i = 0; i < bias_size; i++) {
        *(b_data + i) /= (1 << (b_fp - out_fp));
      }
    } else if (b_fp < out_fp) {
      printf(
          "OUTPUT variable has less range bits than BIAS variable. Please "
          "make sure conv/b has same or less range bits than Output to avoid "
          "overflow.\n");
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }

  memset(out_var->v->data, 0, sizeof(int8_t) * output_size);

  batch_size = p->in_var.shape.data[0];
  if (p->spatial_dims == 2) {
    for (b = 0; b < batch_size; ++b) {
      for (g = 0; g < group; ++g) {
        for (om = 0; om < out_vars; ++om) {
          int o_pos[] = {b, g, om};
          var_setpos(out_var, o_pos, _S(o_pos));
          for (im = 0; im < in_vars; ++im) {
            int i_pos[] = {b, g, im};
            int w_pos[] = {g, om, im};
            var_setpos(in_var, i_pos, _S(i_pos));
            var_setpos(w_var, w_pos, _S(w_pos));
            conv2d(out_var, in_var, w_var, p->input_shape, p->output_shape,
                   p->kernel_shape, p->in_position, p->out_position, c->pad,
                   c->stride, c->dilation, p->spatial_dims);
          }
          {
            int b_pos[] = {g, om};
            if (p->a_var.v) {
              var_setpos(a_var, b_pos, _S(b_pos));
              mul_alpha(out_var, a_var);
            }
            if (p->b_var.v) {
              var_setpos(b_var, b_pos, _S(b_pos));
              add_bias(out_var, b_var);
            }
          }
        }
      }
    }
  } else {
    for (b = 0; b < batch_size; ++b) {
      for (g = 0; g < group; ++g) {
        for (om = 0; om < out_vars; ++om) {
          int o_pos[] = {b, g, om};
          var_setpos(out_var, o_pos, _S(o_pos));
          for (im = 0; im < in_vars; ++im) {
            int i_pos[] = {b, g, im};
            int w_pos[] = {g, om, im};
            var_setpos(in_var, i_pos, _S(i_pos));
            var_setpos(w_var, w_pos, _S(w_pos));
            convnd(out_var, in_var, w_var, p->input_shape, p->output_shape,
                   p->kernel_shape, p->in_position, p->out_position, c->pad,
                   c->stride, c->dilation, p->spatial_dims);
          }
          {
            int b_pos[] = {g, om};
            if (p->a_var.v) {
              var_setpos(a_var, b_pos, _S(b_pos));
              mul_alpha(out_var, a_var);
            }
            if (p->b_var.v) {
              var_setpos(b_var, b_pos, _S(b_pos));
              add_bias(out_var, b_var);
            }
          }
        }
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}